

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall
CommandLineArguments::setOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  undefined1 uVar1;
  byte bVar2;
  SimpleString *this_00;
  long in_RDI;
  SimpleString outputType;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  byte bVar3;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff2f;
  SimpleString *in_stack_ffffffffffffff30;
  SimpleString *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  uint uVar5;
  CommandLineArguments *in_stack_ffffffffffffff88;
  undefined1 local_1;
  
  SimpleString::SimpleString
            (in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,
                              CONCAT16(in_stack_ffffffffffffff2e,
                                       CONCAT15(in_stack_ffffffffffffff2d,
                                                CONCAT14(in_stack_ffffffffffffff2c,
                                                         CONCAT13(in_stack_ffffffffffffff2b,
                                                                  CONCAT12(in_stack_ffffffffffffff2a
                                                                           ,
                                                  in_stack_ffffffffffffff28)))))));
  getParameterField(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                    in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SimpleString::~SimpleString((SimpleString *)0x1884a5);
  this_00 = (SimpleString *)SimpleString::size((SimpleString *)0x1884b2);
  if (this_00 == (SimpleString *)0x0) {
    local_1 = false;
  }
  else {
    uVar5 = 0;
    SimpleString::SimpleString
              (this_00,(char *)CONCAT17(in_stack_ffffffffffffff2f,
                                        CONCAT16(in_stack_ffffffffffffff2e,
                                                 CONCAT15(in_stack_ffffffffffffff2d,
                                                          CONCAT14(in_stack_ffffffffffffff2c,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           in_stack_ffffffffffffff28)))))));
    uVar1 = ::operator==(this_00,(SimpleString *)
                                 CONCAT17(in_stack_ffffffffffffff2f,
                                          CONCAT16(in_stack_ffffffffffffff2e,
                                                   CONCAT15(in_stack_ffffffffffffff2d,
                                                            CONCAT14(in_stack_ffffffffffffff2c,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           in_stack_ffffffffffffff28)))))));
    bVar3 = true;
    if (!(bool)uVar1) {
      SimpleString::SimpleString
                (this_00,(char *)CONCAT17(uVar1,CONCAT16(1,CONCAT15(in_stack_ffffffffffffff2d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  CONCAT13(in_stack_ffffffffffffff2b,
                                                           CONCAT12(in_stack_ffffffffffffff2a,
                                                                    in_stack_ffffffffffffff28)))))))
      ;
      uVar5 = 0x1000000;
      in_stack_ffffffffffffff2d =
           ::operator==(this_00,(SimpleString *)
                                CONCAT17(uVar1,CONCAT16(bVar3,CONCAT15(in_stack_ffffffffffffff2d,
                                                                       CONCAT14(
                                                  in_stack_ffffffffffffff2c,
                                                  CONCAT13(in_stack_ffffffffffffff2b,
                                                           CONCAT12(in_stack_ffffffffffffff2a,
                                                                    in_stack_ffffffffffffff28)))))))
      ;
      bVar3 = in_stack_ffffffffffffff2d;
    }
    uVar4 = bVar3;
    if ((uVar5 & 0x1000000) != 0) {
      SimpleString::~SimpleString((SimpleString *)0x1885b1);
    }
    SimpleString::~SimpleString((SimpleString *)0x1885bb);
    if ((bVar3 & 1) == 0) {
      SimpleString::SimpleString
                (this_00,(char *)CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffff2d,
                                                                        CONCAT14(bVar3,CONCAT13(
                                                  in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           in_stack_ffffffffffffff28)))))));
      bVar2 = ::operator==(this_00,(SimpleString *)
                                   CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffff2d,
                                                                          CONCAT14(bVar3,CONCAT13(
                                                  in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           in_stack_ffffffffffffff28)))))));
      SimpleString::~SimpleString((SimpleString *)0x18866c);
      if ((bVar2 & 1) == 0) {
        SimpleString::SimpleString
                  (this_00,(char *)CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffff2d,
                                                                          CONCAT14(bVar3,CONCAT13(
                                                  bVar2,CONCAT12(in_stack_ffffffffffffff2a,
                                                                 in_stack_ffffffffffffff28)))))));
        bVar3 = ::operator==(this_00,(SimpleString *)
                                     CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff2d,
                                                  CONCAT14(bVar3,CONCAT13(bVar2,CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))));
        SimpleString::~SimpleString((SimpleString *)0x1886f2);
        if ((bVar3 & 1) == 0) {
          local_1 = false;
        }
        else {
          *(undefined4 *)(in_RDI + 0x48) = 2;
          local_1 = true;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x48) = 1;
        local_1 = true;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x48) = 0;
      local_1 = true;
    }
  }
  SimpleString::~SimpleString((SimpleString *)0x18875d);
  return local_1;
}

Assistant:

bool CommandLineArguments::setOutputType(int ac, const char *const *av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}